

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall
TestSchema::readNestedRecord<avro::Parser<avro::ReaderImpl<avro::NullValidator>>>
          (TestSchema *this,Parser<avro::ReaderImpl<avro::NullValidator>_> *p)

{
  ostream *this_00;
  undefined4 local_70;
  float f;
  char *local_68;
  char *local_60;
  const_string local_58;
  const_string local_48;
  undefined **local_38;
  undefined1 local_30;
  undefined8 *local_28;
  char *local_20;
  
  f = avro::Parser<avro::ReaderImpl<avro::NullValidator>_>::readFloat(p);
  this_00 = (ostream *)std::ostream::operator<<(&std::cout,f);
  std::operator<<(this_00,'\n');
  local_48.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_48.m_end = "";
  local_58.m_begin = "";
  local_58.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_48,0x148,&local_58);
  local_30 = 0;
  local_38 = &PTR__lazy_ostream_001f1370;
  local_28 = &boost::unit_test::lazy_ostream::inst;
  local_20 = "";
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
  ;
  local_60 = "";
  local_70 = 0xc2ca33b6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,float,float>
            (&local_38,&local_68,0x148,1,2,&f,"f",&local_70,"-101.101f");
  return;
}

Assistant:

void readNestedRecord(Parser &p)
    {
        printNext(p);
        p.readRecord();
        printNext(p);
        float f = p.readFloat();
        std::cout << f << '\n';
        BOOST_CHECK_EQUAL(f, -101.101f);
        p.readRecordEnd();
    }